

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::encode
          (AnnotatedEnumHandler *this,JsonCodec *codec,DynamicEnum input,Builder output)

{
  StringPtr *pSVar1;
  char *pcVar2;
  size_t sVar3;
  WirePointer *pWVar4;
  CapTableBuilder *pCVar5;
  Reader value;
  Fault local_78;
  DynamicEnum local_70;
  SegmentBuilder *local_60;
  CapTableBuilder *pCStack_58;
  WirePointer *local_50;
  size_t local_48;
  bool local_40;
  
  local_70.schema = input.schema.super_Schema.raw;
  local_70.value = input.value;
  DynamicEnum::getEnumerant((Maybe<capnp::EnumSchema::Enumerant> *)&local_60,&local_70);
  pWVar4 = local_50;
  if ((char)local_60 == '\x01') {
    pCVar5 = (CapTableBuilder *)((ulong)local_50 & 0xffff);
    pCStack_58 = (CapTableBuilder *)(this->valueToName).size_;
    local_60 = (SegmentBuilder *)CONCAT44(local_60._4_4_,(uint)(ushort)local_50);
    local_50 = (WirePointer *)0x21004b;
    local_48 = 4;
    local_40 = pCVar5 < pCStack_58;
    if (pCStack_58 <= pCVar5) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x56b,FAILED,"e.getIndex() < valueToName.size()","_kjCondition,",
                 (DebugComparison<unsigned_int,_unsigned_long> *)&local_60);
      kj::_::Debug::Fault::fatal(&local_78);
    }
    pSVar1 = (this->valueToName).ptr;
    pcVar2 = pSVar1[(ulong)pWVar4 & 0xffff].content.ptr;
    sVar3 = pSVar1[(ulong)pWVar4 & 0xffff].content.size_;
    *(undefined2 *)output._builder.data = 3;
    local_60 = output._builder.segment;
    pCStack_58 = output._builder.capTable;
    local_50 = output._builder.pointers;
    value.super_StringPtr.content.size_ = sVar3;
    value.super_StringPtr.content.ptr = pcVar2;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_60,value);
  }
  else {
    *(undefined2 *)output._builder.data = 2;
    *(double *)((long)output._builder.data + 8) = (double)local_70.value;
  }
  return;
}

Assistant:

void encode(const JsonCodec& codec, DynamicEnum input, JsonValue::Builder output) const override {
    KJ_IF_SOME(e, input.getEnumerant()) {
      KJ_ASSERT(e.getIndex() < valueToName.size());
      output.setString(valueToName[e.getIndex()]);
    } else {
      output.setNumber(input.getRaw());
    }